

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O1

bool __thiscall CCoinsViewDB::GetCoin(CCoinsViewDB *this,COutPoint *outpoint,Coin *coin)

{
  CDBWrapper *this_00;
  Span<const_std::byte> sp;
  uint uVar1;
  long in_FS_OFFSET;
  bool bVar2;
  Span<const_std::byte> key;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strValue;
  DataStream DStack_a8;
  DataStream local_88;
  Wrapper<ScriptCompression,_CScript_&> local_60;
  Wrapper<AmountCompression,_long_&> local_58;
  COutPoint *local_50;
  uchar local_48 [8];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_40;
  bool local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_db)._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
            _M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl;
  local_48[0] = 'C';
  local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_read_pos = 0;
  local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = outpoint;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve(&local_88.vch,0x40);
  local_40._M_value._M_dataplus._M_p = (_Alloc_hider)&local_50->n;
  SerializeMany<DataStream,unsigned_char,transaction_identifier<false>,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (&local_88,local_48,&local_50->hash,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)&local_40);
  key.m_data = local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start + local_88.m_read_pos;
  key.m_size = (long)local_88.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)key.m_data;
  CDBWrapper::ReadImpl_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40,this_00,key);
  bVar2 = local_20 != false;
  if (bVar2) {
    sp.m_size = local_40._M_value._M_string_length;
    sp.m_data = (byte *)local_40._M_value._M_dataplus._M_p;
    DataStream::DataStream(&DStack_a8,sp);
    DataStream::Xor(&DStack_a8,&this_00->obfuscate_key);
    uVar1 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(&DStack_a8);
    *(uint *)&coin->field_0x28 = uVar1;
    local_60.m_object = &(coin->out).scriptPubKey;
    local_58.m_object = (long *)coin;
    ActionUnserialize::
    SerReadWriteMany<DataStream,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
              (&DStack_a8,&local_58,&local_60);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_a8);
  }
  if ((local_20 == true) &&
     (local_20 = false,
     local_40._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_40._M_value + 0x10))) {
    operator_delete((void *)local_40._M_value._M_dataplus._M_p,local_40._16_8_ + 1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CCoinsViewDB::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    return m_db->Read(CoinEntry(&outpoint), coin);
}